

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block.cpp
# Opt level: O1

bool __thiscall
spvtools::val::BasicBlock::structurally_postdominates(BasicBlock *this,BasicBlock *other)

{
  bool bVar1;
  BasicBlock *local_130;
  undefined8 local_128;
  _Any_data _Stack_120;
  _Manager_type p_Stack_110;
  _Invoker_type local_108;
  DominatorIterator local_f8;
  BasicBlock *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  code *local_b8;
  code *pcStack_b0;
  BasicBlock *local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  code *pcStack_90;
  undefined8 local_88;
  DominatorIterator local_78;
  DominatorIterator local_50;
  
  if (this == other) {
    bVar1 = true;
  }
  else {
    local_50.dom_func_._M_invoker = (_Invoker_type)0x0;
    local_50.dom_func_.super__Function_base._M_manager = (_Manager_type)0x0;
    local_50.dom_func_.super__Function_base._M_functor._8_8_ = 0;
    local_50.dom_func_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    local_50.current_ = (BasicBlock *)0x0;
    local_88 = 0;
    pcStack_90 = (code *)0x0;
    local_98 = 0;
    uStack_a0 = 0;
    local_a8 = (BasicBlock *)0x0;
    pcStack_b0 = std::
                 _Function_handler<const_spvtools::val::BasicBlock_*(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/basic_block.cpp:153:34)>
                 ::_M_invoke;
    local_b8 = std::
               _Function_handler<const_spvtools::val::BasicBlock_*(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/basic_block.cpp:153:34)>
               ::_M_manager;
    uStack_c0 = 0;
    local_c8 = 0;
    local_f8.dom_func_._M_invoker =
         std::
         _Function_handler<const_spvtools::val::BasicBlock_*(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/basic_block.cpp:153:34)>
         ::_M_invoke;
    local_f8.dom_func_.super__Function_base._M_manager =
         std::
         _Function_handler<const_spvtools::val::BasicBlock_*(const_spvtools::val::BasicBlock_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/basic_block.cpp:153:34)>
         ::_M_manager;
    local_f8.dom_func_.super__Function_base._M_functor._8_8_ = 0;
    local_f8.dom_func_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    _Stack_120._8_8_ = 0;
    _Stack_120._M_unused._M_object = (void *)0x0;
    local_128 = 0;
    local_130 = this;
    p_Stack_110 = local_50.dom_func_.super__Function_base._M_manager;
    local_108 = local_50.dom_func_._M_invoker;
    local_f8.current_ = other;
    local_d0 = other;
    std::
    __find_if<spvtools::val::BasicBlock::DominatorIterator,__gnu_cxx::__ops::_Iter_equals_val<spvtools::val::BasicBlock_const*const>>
              (&local_78,&local_f8,&local_50,
               (_Iter_equals_val<const_spvtools::val::BasicBlock_*const>)&local_130);
    if (local_50.dom_func_.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_50.dom_func_.super__Function_base._M_manager)
                ((_Any_data *)&local_50.dom_func_,(_Any_data *)&local_50.dom_func_,__destroy_functor
                );
    }
    if (local_f8.dom_func_.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_f8.dom_func_.super__Function_base._M_manager)
                ((_Any_data *)&local_f8.dom_func_,(_Any_data *)&local_f8.dom_func_,__destroy_functor
                );
    }
    bVar1 = local_a8 != local_78.current_;
  }
  if (this != other) {
    if (local_78.dom_func_.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_78.dom_func_.super__Function_base._M_manager)
                ((_Any_data *)&local_78.dom_func_,(_Any_data *)&local_78.dom_func_,__destroy_functor
                );
    }
    if (p_Stack_110 != (_Manager_type)0x0) {
      (*p_Stack_110)(&_Stack_120,&_Stack_120,__destroy_functor);
    }
  }
  if (this != other) {
    if (local_b8 != (code *)0x0) {
      (*local_b8)(&local_c8,&local_c8,3);
    }
    if (pcStack_90 != (code *)0x0) {
      (*pcStack_90)(&uStack_a0,&uStack_a0,3);
    }
  }
  return bVar1;
}

Assistant:

bool BasicBlock::structurally_postdominates(const BasicBlock& other) const {
  return (this == &other) || !(other.structural_pdom_end() ==
                               std::find(other.structural_pdom_begin(),
                                         other.structural_pdom_end(), this));
}